

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setVolumeMeshToInspect(SlicePlane *this,string *meshname)

{
  VolumeMesh *pVVar1;
  string *in_RSI;
  long in_RDI;
  VolumeMesh *this_00;
  VolumeMesh *meshToInspect;
  VolumeMesh *oldMeshToInspect;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  VolumeMesh *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffb0;
  string local_38 [32];
  VolumeMesh *local_18;
  
  std::__cxx11::string::string(local_38,(string *)(in_RDI + 0x1b0));
  pVVar1 = getVolumeMesh(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_38);
  local_18 = pVVar1;
  if (pVVar1 != (VolumeMesh *)0x0) {
    VolumeMesh::removeSlicePlaneListener
              (in_stack_ffffffffffffff90,
               (SlicePlane *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  this_00 = (VolumeMesh *)(in_RDI + 0x1b0);
  std::__cxx11::string::operator=((string *)this_00,in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff90,(string *)this_00);
  pVVar1 = getVolumeMesh(in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  if (pVVar1 == (VolumeMesh *)0x0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x1b0),"");
    *(undefined1 *)(in_RDI + 0x1a8) = 0;
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)pVVar1)
    ;
  }
  else {
    PersistentValue<bool>::operator=
              ((PersistentValue<bool> *)this_00,
               (bool *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    VolumeMesh::addSlicePlaneListener
              (this_00,(SlicePlane *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    Structure::setCullWholeElements((Structure *)this_00,(bool)in_stack_ffffffffffffff4f);
    VolumeMesh::ensureHaveTets(this_00);
    *(undefined1 *)(in_RDI + 0x1a8) = 1;
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)pVVar1)
    ;
  }
  return;
}

Assistant:

void SlicePlane::setVolumeMeshToInspect(std::string meshname) {
  VolumeMesh* oldMeshToInspect = polyscope::getVolumeMesh(inspectedMeshName);
  if (oldMeshToInspect != nullptr) {
    oldMeshToInspect->removeSlicePlaneListener(this);
  }
  inspectedMeshName = meshname;
  VolumeMesh* meshToInspect = polyscope::getVolumeMesh(inspectedMeshName);
  if (meshToInspect == nullptr) {
    inspectedMeshName = "";
    shouldInspectMesh = false;
    volumeInspectProgram.reset();
    return;
  }
  drawPlane = false;
  meshToInspect->addSlicePlaneListener(this);
  meshToInspect->setCullWholeElements(false);
  meshToInspect->ensureHaveTets(); // do this as early as possible because it is expensive
  shouldInspectMesh = true;
  volumeInspectProgram.reset();
}